

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O2

void __thiscall Neuron::connectTo(Neuron *this,Neuron *target,float weight)

{
  Connection local_18;
  
  local_18.m_max = 100.0;
  local_18.m_expire = 100.0;
  local_18.m_target = target;
  local_18.m_weight = weight;
  std::vector<Connection,_std::allocator<Connection>_>::emplace_back<Connection>
            (&this->m_connections,&local_18);
  return;
}

Assistant:

void Neuron::connectTo(Neuron* target, float weight)
{
    m_connections.push_back({target, weight});
}